

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partitioned_tuple_data.cpp
# Opt level: O3

void __thiscall
duckdb::PartitionedTupleData::FlushAppendState
          (PartitionedTupleData *this,PartitionedTupleDataAppendState *state)

{
  pointer pTVar1;
  type pTVar2;
  TupleDataAllocator *this_00;
  ulong uVar3;
  long lVar4;
  pointer puVar5;
  TupleDataSegment *segment;
  long lVar6;
  
  puVar5 = (this->partitions).
           super_vector<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->partitions).
      super_vector<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != puVar5) {
    lVar6 = 0;
    lVar4 = 0;
    uVar3 = 0;
    do {
      pTVar2 = unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
               ::operator*((unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
                            *)((long)&(puVar5->
                                      super_unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>_>
                                      )._M_t.
                                      super___uniq_ptr_impl<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_duckdb::TupleDataCollection_*,_std::default_delete<duckdb::TupleDataCollection>_>
                                      .super__Head_base<0UL,_duckdb::TupleDataCollection_*,_false>.
                                      _M_head_impl + lVar4));
      pTVar1 = (state->partition_pin_states).
               super_vector<duckdb::TupleDataPinState,_std::allocator<duckdb::TupleDataPinState>_>.
               super__Vector_base<duckdb::TupleDataPinState,_std::allocator<duckdb::TupleDataPinState>_>
               ._M_impl.super__Vector_impl_data._M_start;
      segment = (pTVar2->segments).
                super_vector<duckdb::TupleDataSegment,_std::allocator<duckdb::TupleDataSegment>_>.
                super__Vector_base<duckdb::TupleDataSegment,_std::allocator<duckdb::TupleDataSegment>_>
                ._M_impl.super__Vector_impl_data._M_finish + -1;
      this_00 = shared_ptr<duckdb::TupleDataAllocator,_true>::operator->(&segment->allocator);
      TupleDataAllocator::ReleaseOrStoreHandles
                (this_00,(TupleDataPinState *)((long)&(pTVar1->row_handles).handles + lVar6),segment
                );
      uVar3 = uVar3 + 1;
      puVar5 = (this->partitions).
               super_vector<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar4 = lVar4 + 8;
      lVar6 = lVar6 + 0x38;
    } while (uVar3 < (ulong)((long)(this->partitions).
                                   super_vector<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
                                   .
                                   super__Vector_base<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)puVar5 >> 3));
  }
  return;
}

Assistant:

void PartitionedTupleData::FlushAppendState(PartitionedTupleDataAppendState &state) {
	for (idx_t partition_index = 0; partition_index < partitions.size(); partition_index++) {
		auto &partition = *partitions[partition_index];
		auto &partition_pin_state = state.partition_pin_states[partition_index];
		partition.FinalizePinState(partition_pin_state);
	}
}